

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_sink_test.cc
# Opt level: O0

void __thiscall
google::protobuf::io::zc_sink_internal::anon_unknown_0::ZeroCopyStreamByteSinkTest_WriteLong_Test::
~ZeroCopyStreamByteSinkTest_WriteLong_Test(ZeroCopyStreamByteSinkTest_WriteLong_Test *this)

{
  ZeroCopyStreamByteSinkTest_WriteLong_Test *this_local;
  
  ~ZeroCopyStreamByteSinkTest_WriteLong_Test(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(ZeroCopyStreamByteSinkTest, WriteLong) {
  do {
    SCOPED_TRACE(output_chunks_.PatternAsQuotedString());
    ChunkedString input("0123456789A", 1);

    do {
      SCOPED_TRACE(input.PatternAsQuotedString());
      output_ = {};
      PatternedOutputStream output_stream(output_chunks_);
      ZeroCopyStreamByteSink byte_sink(&output_stream);
      SCOPED_TRACE(input.PatternAsQuotedString());
      absl::string_view chunk;
      while (!(chunk = input.NextChunk()).empty()) {
        byte_sink.Append(chunk.data(), chunk.size());
      }
    } while (input.NextPattern());

    ASSERT_EQ(output_view_, "0123456789");
  } while (output_chunks_.NextPattern());
}